

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void SubtractionHelper<long,unsigned_char,9>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (long *lhs,uchar *rhs,long *result)

{
  long *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  if ((long)(*in_RDI - (ulong)*in_RSI) <= *in_RDI) {
    *in_RDX = *in_RDI - (ulong)*in_RSI;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}